

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O3

unsigned_long
cppforth::Forth::parseUnsignedNumber
          (const_iterator beginIt,const_iterator endIt,const_iterator *it,int numericBase)

{
  byte bVar1;
  unsigned_long uVar2;
  int iVar3;
  
  it->_M_current = (char *)beginIt;
  if (endIt._M_current <= beginIt._M_current) {
    return 0;
  }
  uVar2 = 0;
  do {
    bVar1 = *beginIt._M_current;
    if ((numericBase < 0xb) ||
       ((bVar1 < 0x41 || numericBase + 0x37U <= (uint)bVar1 &&
        (bVar1 < 0x61 || numericBase + 0x57U <= (uint)bVar1)))) {
      if (bVar1 < 0x30) {
        return uVar2;
      }
      if (numericBase + 0x30 <= (int)(uint)bVar1) {
        return uVar2;
      }
    }
    iVar3 = -0x37;
    if (bVar1 < 0x41) {
      iVar3 = -0x30;
    }
    if (0x60 < bVar1) {
      iVar3 = -0x57;
    }
    uVar2 = uVar2 * (long)numericBase + (ulong)(iVar3 + (uint)bVar1);
    beginIt._M_current = beginIt._M_current + 1;
    it->_M_current = (char *)beginIt;
    if (beginIt._M_current == endIt._M_current) {
      return uVar2;
    }
  } while( true );
}

Assistant:

static unsigned long parseUnsignedNumber(const std::string::const_iterator beginIt, const std::string::const_iterator endIt, 
				std::string::const_iterator &it, int numericBase) {
			it = beginIt;
			unsigned long value=0;
			while (it < endIt) {
				auto c = (*it);
				if (isValidDigit(c, numericBase)) {
					auto n = digitValue(c);
					value = value * numericBase + n;
					++it;
				}
				else {
					break;
				}
			}
			return value;
		}